

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QUEUE *this;
  uint uVar6;
  QUEUE *s;
  queue<int,_std::deque<int,_std::allocator<int>_>_> arg_list;
  int e;
  cmd_paresr lab01_parser;
  _Deque_base<int,_std::allocator<int>_> local_138;
  cmd_paresr local_d8;
  
  cmd_paresr::cmd_paresr(&local_d8,argc,argv);
  s = (QUEUE *)0x0;
  do {
    iVar2 = cmd_paresr::now_pos(&local_d8);
    iVar3 = cmd_paresr::ops_num(&local_d8);
    if (iVar3 <= iVar2) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
      std::
      deque<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
      ::~deque(&local_d8.args.c);
      std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
                ((_Deque_base<char,_std::allocator<char>_> *)&local_d8.ops);
      return 0;
    }
    local_138._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_138._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_138,0);
    cVar1 = cmd_paresr::next_step
                      (&local_d8,(queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_138);
    this = s;
    switch(cVar1) {
    case 'A':
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," A",2);
      uVar6 = *local_138._M_impl.super__Deque_impl_data._M_start._M_cur;
      this = (QUEUE *)operator_new(0x30);
      QUEUE::QUEUE(this,uVar6);
      (*(this->super_STACK)._vptr_STACK[10])(this,s);
      if (local_138._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_138._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_138._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_138._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_138._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_138._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)((uint *)local_138._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80)
        ;
        local_138._M_impl.super__Deque_impl_data._M_start._M_first =
             local_138._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_138._M_impl.super__Deque_impl_data._M_start._M_node =
             local_138._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_138._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_138._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      (*(this->super_STACK)._vptr_STACK[6])(this);
      break;
    case 'B':
    case 'D':
    case 'E':
    case 'F':
    case 'H':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
      break;
    case 'C':
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," C",2);
      this = (QUEUE *)operator_new(0x30);
      QUEUE::QUEUE(this,s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      (*(this->super_STACK)._vptr_STACK[6])(this);
      break;
    case 'G':
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," G",2);
      uVar6 = *local_138._M_impl.super__Deque_impl_data._M_start._M_cur;
      iVar2 = (*(s->super_STACK)._vptr_STACK[1])(s);
      if (iVar2 <= (int)uVar6) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," E",2);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_001029a8:
        exit(0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar2 = (*(s->super_STACK)._vptr_STACK[2])(s,(ulong)uVar6);
      std::ostream::operator<<((ostream *)&std::cout,iVar2);
LAB_001025f8:
      if (local_138._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_138._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_138._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_138._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_138._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_138._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)((uint *)local_138._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80)
        ;
        local_138._M_impl.super__Deque_impl_data._M_start._M_first =
             local_138._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_138._M_impl.super__Deque_impl_data._M_start._M_node =
             local_138._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_138._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_138._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      break;
    case 'I':
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," I",2);
      iVar3 = (int)((ulong)((long)local_138._M_impl.super__Deque_impl_data._M_start._M_last -
                           (long)local_138._M_impl.super__Deque_impl_data._M_start._M_cur) >> 2) +
              (int)((ulong)((long)local_138._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)local_138._M_impl.super__Deque_impl_data._M_finish._M_first) >> 2)
              + ((((uint)((int)local_138._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (int)local_138._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
                + (uint)(local_138._M_impl.super__Deque_impl_data._M_finish._M_node ==
                        (_Map_pointer)0x0)) * 0x80;
      iVar2 = iVar3;
      if (0 < iVar3) {
        do {
          iVar4 = (*(s->super_STACK)._vptr_STACK[9])(s);
          if (iVar4 != 0) {
            iVar4 = (**(s->super_STACK)._vptr_STACK)(s);
            iVar5 = (*(s->super_STACK)._vptr_STACK[1])(s);
            if (iVar4 - iVar5 < iVar3) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," E",2);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              goto LAB_001029a8;
            }
          }
          (*(s->super_STACK)._vptr_STACK[3])
                    (s,(ulong)(uint)*local_138._M_impl.super__Deque_impl_data._M_start._M_cur);
          if (local_138._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_138._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_138._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_138._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_138._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_138._M_impl.super__Deque_impl_data._M_start._M_last =
                 (_Elt_pointer)
                 ((uint *)local_138._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80);
            local_138._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_138._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_138._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_138._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_138._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_138._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      (*(s->super_STACK)._vptr_STACK[6])(s);
      break;
    case 'N':
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," N",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar2 = (*(s->super_STACK)._vptr_STACK[1])(s);
      std::ostream::operator<<((ostream *)&std::cout,iVar2);
      break;
    case 'O':
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," O",2);
      uVar6 = *local_138._M_impl.super__Deque_impl_data._M_start._M_cur;
      iVar2 = (*(s->super_STACK)._vptr_STACK[1])(s);
      if (iVar2 < (int)uVar6) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," E",2);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        goto LAB_001029a8;
      }
      if (0 < (int)uVar6) {
        do {
          (*(s->super_STACK)._vptr_STACK[4])(s);
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      if (local_138._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_138._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_138._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_138._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_138._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_138._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)((uint *)local_138._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80)
        ;
        local_138._M_impl.super__Deque_impl_data._M_start._M_first =
             local_138._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_138._M_impl.super__Deque_impl_data._M_start._M_node =
             local_138._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_138._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_138._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      iVar2 = (*(s->super_STACK)._vptr_STACK[1])(s);
      if (iVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        (*(s->super_STACK)._vptr_STACK[6])(s);
      }
      break;
    default:
      if (cVar1 == 'S') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S",1);
        uVar6 = *local_138._M_impl.super__Deque_impl_data._M_start._M_cur;
        this = (QUEUE *)operator_new(0x30);
        QUEUE::QUEUE(this,uVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        std::ostream::operator<<((ostream *)&std::cout,uVar6);
        goto LAB_001025f8;
      }
    }
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_138);
    s = this;
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  char op;
  int arg;
  QUEUE *myqueue = nullptr;
  // Set output file
  cmd_paresr lab01_parser = cmd_paresr(argc, argv);
  while (lab01_parser.now_pos() < lab01_parser.ops_num()) {
    queue<int> arg_list;
    op = lab01_parser.next_step(arg_list);
    switch (op) {
      case 'S': {
        cout << "S";
        arg = arg_list.front();
        myqueue = new QUEUE(arg);
        cout << " " << arg;
        arg_list.pop();
        break;
      }
      case 'I': {
        cout << " I";
        int size = arg_list.size();
        for (int i = 0; i < size; i++) {
          // Test if the stack can overflow
          if (myqueue->full()) {
            if (myqueue->size() - int(*myqueue) < size) {
              cout << " E" << endl;
              exit(0);
            }
          }
          arg = arg_list.front();
          *myqueue << arg;
          arg_list.pop();
        }
        cout << " ";
        myqueue->print();
        break;
      }
      case 'O': {
        cout << " O";
        int e;
        arg = arg_list.front();
        // Test if the stack can be empty
        if (int(*myqueue) < arg) {
          cout << " E" << endl;
          exit(0);
        }
        for (int i = 0; i < arg; i++)
          *myqueue >> e;
        arg_list.pop();
        if (int(*myqueue) != 0) {
          cout << " ";
          myqueue->print();
        }
        break;
      }
      case 'A': {
        cout << " A";
        arg = arg_list.front();
        QUEUE *new_stack = new QUEUE(arg);
        *new_stack = *myqueue;
        myqueue = new_stack;
        arg_list.pop();
        cout << " ";
        myqueue->print();
        break;
      }
      case 'C': {
        cout << " C";
        QUEUE *new_stack = new QUEUE(*myqueue);
        myqueue = new_stack;
        cout << " ";
        myqueue->print();
        break;
      }
      case 'N': {
        cout << " N";
        cout << " " << int(*myqueue);        
        break;
      }
      case 'G': {
        cout << " G";
        arg = arg_list.front();
        if (arg >= int(*myqueue)) {
          cout << " E" << endl;
          exit(0);
        }
        cout << " " << (*myqueue)[arg];
        arg_list.pop();
        break;
      }
    }
  }
  cout << endl;
  return 0;
}